

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppressionValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)610>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  uint64 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  NonMaximumSuppression *pNVar11;
  Type *pTVar12;
  Type *pTVar13;
  Type *pTVar14;
  FeatureType *pFVar15;
  ostream *poVar16;
  FeatureType *pFVar17;
  size_t sVar18;
  long *plVar19;
  ArrayFeatureType_EnumeratedShapes *pAVar20;
  Type *pTVar21;
  long lVar22;
  ulong *puVar23;
  ArrayFeatureType *pAVar24;
  ArrayFeatureType_EnumeratedShapes *pAVar25;
  size_type *psVar26;
  element_type *peVar27;
  ulong uVar28;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  int iVar29;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_04;
  Result result;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  Result *local_2a8;
  undefined1 local_2a0 [32];
  size_type *local_280;
  TypeUnion local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  Type *local_258;
  int local_24c;
  RepeatedPtrFieldBase *local_248;
  int local_240;
  int local_23c;
  RepeatedPtrFieldBase *local_238;
  ModelDescription *local_230;
  NonMaximumSuppression *local_228;
  undefined1 local_220 [8];
  _Alloc_hider local_218;
  undefined1 local_210 [112];
  ios_base local_1a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Model *local_78;
  string local_70;
  string local_50;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x262) {
    pNVar11 = (NonMaximumSuppression *)(format->Type_).pipeline_;
  }
  else {
    pNVar11 = Specification::NonMaximumSuppression::default_instance();
  }
  Result::Result((Result *)&local_280);
  validateModelDescription((Result *)local_220,interface,format->specificationversion_);
  local_280 = (size_type *)local_220;
  std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
  if (local_218._M_p != local_210 + 8) {
    operator_delete(local_218._M_p,local_210._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_280);
  if (!bVar6) goto LAB_004f62d8;
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_004f6304:
    std::operator+(&local_2c8,"Expected feature \'",(pNVar11->confidenceinputfeaturename_).ptr_);
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_220 = (undefined1  [8])local_210;
    psVar26 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar26) {
      local_210._0_8_ = *psVar26;
      local_210._8_8_ = plVar19[3];
    }
    else {
      local_210._0_8_ = *psVar26;
      local_220 = (undefined1  [8])*plVar19;
    }
    local_218._M_p = (pointer)plVar19[1];
    *plVar19 = (long)psVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)local_220);
  }
  else {
    local_248 = &(interface->input_).super_RepeatedPtrFieldBase;
    local_238 = &(interface->output_).super_RepeatedPtrFieldBase;
    iVar29 = 0;
    local_258 = (Type *)CONCAT44(local_258._4_4_,0xffffffff);
    local_24c = -1;
    local_23c = -1;
    iVar8 = -1;
    local_2a8 = __return_storage_ptr__;
    local_230 = interface;
    local_228 = pNVar11;
    local_78 = format;
    do {
      pNVar11 = local_228;
      local_240 = iVar8;
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (local_248,iVar29);
      pbVar3 = (pTVar12->name_).ptr_;
      iVar7 = std::__cxx11::string::compare((string *)(pNVar11->confidenceinputfeaturename_).ptr_);
      iVar8 = (int)local_258;
      if (iVar7 == 0) {
        iVar8 = iVar29;
      }
      local_258 = (Type *)CONCAT44(local_258._4_4_,iVar8);
      iVar8 = std::__cxx11::string::compare((string *)(pNVar11->coordinatesinputfeaturename_).ptr_);
      if (iVar8 == 0) {
        local_24c = iVar29;
      }
      iVar9 = std::__cxx11::string::compare((string *)(pNVar11->iouthresholdinputfeaturename_).ptr_)
      ;
      if (iVar9 == 0) {
        local_23c = iVar29;
      }
      iVar10 = std::__cxx11::string::compare
                         ((string *)(pNVar11->confidencethresholdinputfeaturename_).ptr_);
      __return_storage_ptr__ = local_2a8;
      if ((((iVar7 != 0) && (iVar8 != 0)) && (iVar9 != 0)) && (iVar10 != 0)) {
        std::operator+(&local_2c8,"Input feature \'",pbVar3);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        __return_storage_ptr__ = local_2a8;
        local_220 = (undefined1  [8])local_210;
        psVar26 = (size_type *)(plVar19 + 2);
        if ((size_type *)*plVar19 == psVar26) {
          local_210._0_8_ = *psVar26;
          local_210._8_8_ = plVar19[3];
        }
        else {
          local_210._0_8_ = *psVar26;
          local_220 = (undefined1  [8])*plVar19;
        }
        local_218._M_p = (pointer)plVar19[1];
        *plVar19 = (long)psVar26;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        Result::Result(local_2a8,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_220);
        goto LAB_004f6446;
      }
      iVar8 = local_240;
      if (iVar10 == 0) {
        iVar8 = iVar29;
      }
      iVar29 = iVar29 + 1;
    } while (iVar29 < (local_230->input_).super_RepeatedPtrFieldBase.current_size_);
    pNVar11 = local_228;
    if ((int)local_258 == -1) goto LAB_004f6304;
    if (local_24c == -1) {
      std::operator+(&local_2c8,"Expected feature \'",(local_228->coordinatesinputfeaturename_).ptr_
                    );
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_220 = (undefined1  [8])local_210;
      psVar26 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar26) {
        local_210._0_8_ = *psVar26;
        local_210._8_8_ = plVar19[3];
      }
      else {
        local_210._0_8_ = *psVar26;
        local_220 = (undefined1  [8])*plVar19;
      }
      local_218._M_p = (pointer)plVar19[1];
      *plVar19 = (long)psVar26;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)local_220);
    }
    else {
      local_240 = iVar8;
      if (0 < (local_230->output_).super_RepeatedPtrFieldBase.current_size_) {
        iVar7 = 0;
        iVar8 = -1;
        iVar29 = -1;
        do {
          pNVar11 = local_228;
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (local_238,iVar7);
          pbVar3 = (pTVar12->name_).ptr_;
          iVar9 = std::__cxx11::string::compare
                            ((string *)(pNVar11->confidenceoutputfeaturename_).ptr_);
          if (iVar9 == 0) {
            iVar8 = iVar7;
          }
          iVar10 = std::__cxx11::string::compare
                             ((string *)(pNVar11->coordinatesoutputfeaturename_).ptr_);
          pNVar11 = local_228;
          if ((iVar9 != 0) && (iVar10 != 0)) {
            std::operator+(&local_2c8,"Output feature \'",pbVar3);
            plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
            local_220 = (undefined1  [8])local_210;
            psVar26 = (size_type *)(plVar19 + 2);
            if ((size_type *)*plVar19 == psVar26) {
              local_210._0_8_ = *psVar26;
              local_210._8_8_ = plVar19[3];
            }
            else {
              local_210._0_8_ = *psVar26;
              local_220 = (undefined1  [8])*plVar19;
            }
            local_218._M_p = (pointer)plVar19[1];
            *plVar19 = (long)psVar26;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                           (string *)local_220);
            goto LAB_004f6446;
          }
          if (iVar10 == 0) {
            iVar29 = iVar7;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < (local_230->output_).super_RepeatedPtrFieldBase.current_size_);
        if (iVar8 != -1) {
          if (iVar29 == -1) {
            std::operator+(&local_2c8,"Expected feature \'",
                           (local_228->coordinatesoutputfeaturename_).ptr_);
            plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
            local_220 = (undefined1  [8])local_210;
            psVar26 = (size_type *)(plVar19 + 2);
            if ((size_type *)*plVar19 == psVar26) {
              local_210._0_8_ = *psVar26;
              local_210._8_8_ = plVar19[3];
            }
            else {
              local_210._0_8_ = *psVar26;
              local_220 = (undefined1  [8])*plVar19;
            }
            local_218._M_p = (pointer)plVar19[1];
            *plVar19 = (long)psVar26;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,
                           (string *)local_220);
            goto LAB_004f6446;
          }
          local_230 = (ModelDescription *)CONCAT44(local_230._4_4_,iVar29);
          psVar4 = (local_228->confidenceinputfeaturename_).ptr_;
          local_2a0._0_4_ = 5;
          __l._M_len = 1;
          __l._M_array = (iterator)local_2a0;
          std::
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    *)&local_2c8,__l,(allocator_type *)&local_98);
          validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                    ((Result *)local_220,(CoreML *)local_248,
                     (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                     &local_2c8,in_R8);
          local_280 = (size_type *)local_220;
          std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
          if (local_218._M_p != local_210 + 8) {
            operator_delete(local_218._M_p,local_210._8_8_ + 1);
          }
          if (local_2c8._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            local_2c8.field_2._M_allocated_capacity -
                            (long)local_2c8._M_dataplus._M_p);
          }
          bVar6 = Result::good((Result *)&local_280);
          if (bVar6) {
            psVar4 = (pNVar11->coordinatesinputfeaturename_).ptr_;
            local_2a0._0_4_ = 5;
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)local_2a0;
            std::
            vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      *)&local_2c8,__l_00,(allocator_type *)&local_98);
            validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                      ((Result *)local_220,(CoreML *)local_248,
                       (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                       &local_2c8,in_R8);
            local_280 = (size_type *)local_220;
            std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
            if (local_218._M_p != local_210 + 8) {
              operator_delete(local_218._M_p,local_210._8_8_ + 1);
            }
            if (local_2c8._M_dataplus._M_p != (char *)0x0) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              local_2c8.field_2._M_allocated_capacity -
                              (long)local_2c8._M_dataplus._M_p);
            }
            bVar6 = Result::good((Result *)&local_280);
            if (!bVar6) goto LAB_004f62d8;
            if (-1 < local_23c) {
              psVar4 = (pNVar11->iouthresholdinputfeaturename_).ptr_;
              local_2a0._0_4_ = 2;
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)local_2a0;
              std::
              vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)&local_2c8,__l_01,(allocator_type *)&local_98);
              validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                        ((Result *)local_220,(CoreML *)local_248,
                         (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                         &local_2c8,in_R8);
              local_280 = (size_type *)local_220;
              std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
              if (local_218._M_p != local_210 + 8) {
                operator_delete(local_218._M_p,local_210._8_8_ + 1);
              }
              if (local_2c8._M_dataplus._M_p != (char *)0x0) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity -
                                (long)local_2c8._M_dataplus._M_p);
              }
              bVar6 = Result::good((Result *)&local_280);
              if (!bVar6) goto LAB_004f62d8;
            }
            if (-1 < local_240) {
              psVar4 = (pNVar11->confidencethresholdinputfeaturename_).ptr_;
              local_2a0._0_4_ = 2;
              __l_02._M_len = 1;
              __l_02._M_array = (iterator)local_2a0;
              std::
              vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)&local_2c8,__l_02,(allocator_type *)&local_98);
              validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                        ((Result *)local_220,(CoreML *)local_248,
                         (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                         &local_2c8,in_R8);
              local_280 = (size_type *)local_220;
              std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
              if (local_218._M_p != local_210 + 8) {
                operator_delete(local_218._M_p,local_210._8_8_ + 1);
              }
              if (local_2c8._M_dataplus._M_p != (char *)0x0) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity -
                                (long)local_2c8._M_dataplus._M_p);
              }
              bVar6 = Result::good((Result *)&local_280);
              if (!bVar6) goto LAB_004f62d8;
            }
            psVar4 = (pNVar11->confidenceoutputfeaturename_).ptr_;
            local_2a0._0_4_ = 5;
            __l_03._M_len = 1;
            __l_03._M_array = (iterator)local_2a0;
            std::
            vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      *)&local_2c8,__l_03,(allocator_type *)&local_98);
            validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                      ((Result *)local_220,(CoreML *)local_238,
                       (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                       &local_2c8,in_R8);
            local_280 = (size_type *)local_220;
            std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
            if (local_218._M_p != local_210 + 8) {
              operator_delete(local_218._M_p,local_210._8_8_ + 1);
            }
            if (local_2c8._M_dataplus._M_p != (char *)0x0) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              local_2c8.field_2._M_allocated_capacity -
                              (long)local_2c8._M_dataplus._M_p);
            }
            bVar6 = Result::good((Result *)&local_280);
            if (!bVar6) goto LAB_004f62d8;
            psVar4 = (pNVar11->coordinatesoutputfeaturename_).ptr_;
            local_2a0._0_4_ = 5;
            __l_04._M_len = 1;
            __l_04._M_array = (iterator)local_2a0;
            std::
            vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      *)&local_2c8,__l_04,(allocator_type *)&local_98);
            validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                      ((Result *)local_220,(CoreML *)local_238,
                       (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar4,
                       &local_2c8,in_R8);
            local_280 = (size_type *)local_220;
            std::__cxx11::string::operator=((string *)&local_278,(string *)&local_218);
            if (local_218._M_p != local_210 + 8) {
              operator_delete(local_218._M_p,local_210._8_8_ + 1);
            }
            if (local_2c8._M_dataplus._M_p != (char *)0x0) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              local_2c8.field_2._M_allocated_capacity -
                              (long)local_2c8._M_dataplus._M_p);
            }
            bVar6 = Result::good((Result *)&local_280);
            if (!bVar6) goto LAB_004f62d8;
            if ((pNVar11->iouthreshold_ < 0.0) || (1.0 < pNVar11->iouthreshold_)) {
              local_220 = (undefined1  [8])local_210;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_220,"iouThreshold must be a value between 0.0 and 1.0.","")
              ;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_220);
LAB_004f6729:
              local_50.field_2._M_allocated_capacity = local_210._0_8_;
              local_50._M_dataplus._M_p = (pointer)local_220;
              __return_storage_ptr__ = local_2a8;
              if (local_220 == (undefined1  [8])local_210) goto LAB_004f647e;
LAB_004f6742:
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
              __return_storage_ptr__ = local_2a8;
              goto LAB_004f647e;
            }
            if (pNVar11->confidencethreshold_ < 0.0) {
              local_220 = (undefined1  [8])local_210;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_220,
                         "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0."
                         ,"");
              Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
              goto LAB_004f6729;
            }
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_248,(int)local_258);
            pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_248,local_24c);
            pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_238,iVar8);
            local_258 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                  (local_238,(int)local_230);
            pFVar15 = pTVar12->type_;
            if (pFVar15 == (FeatureType *)0x0) {
              pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar15->_oneof_case_[0] == 5) {
              pAVar24 = (pFVar15->Type_).multiarraytype_;
            }
            else {
              pAVar24 = Specification::ArrayFeatureType::default_instance();
            }
            pFVar15 = pTVar14->type_;
            if (pFVar15 == (FeatureType *)0x0) {
              pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            iVar8 = pAVar24->datatype_;
            if (pFVar15->_oneof_case_[0] == 5) {
              pAVar24 = (pFVar15->Type_).multiarraytype_;
            }
            else {
              pAVar24 = Specification::ArrayFeatureType::default_instance();
            }
            pFVar15 = pTVar13->type_;
            if (pFVar15 == (FeatureType *)0x0) {
              pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            iVar29 = pAVar24->datatype_;
            if (pFVar15->_oneof_case_[0] == 5) {
              pAVar24 = (pFVar15->Type_).multiarraytype_;
            }
            else {
              pAVar24 = Specification::ArrayFeatureType::default_instance();
            }
            pFVar15 = local_258->type_;
            if (pFVar15 == (FeatureType *)0x0) {
              pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            iVar7 = pAVar24->datatype_;
            if (pFVar15->_oneof_case_[0] == 5) {
              pAVar24 = (pFVar15->Type_).multiarraytype_;
            }
            else {
              pAVar24 = Specification::ArrayFeatureType::default_instance();
            }
            if (((iVar8 != iVar29) || (iVar8 != iVar7)) || (iVar8 != pAVar24->datatype_)) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_220);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,
                         "\'confidence\' and \'coordinates\' must use a same element type, but ",
                         0x41);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"\'input confidence\' is ",0x16);
              pFVar15 = pTVar12->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              paVar1 = &local_2c8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"\'output confidence\' is ",0x17);
              pFVar15 = pTVar14->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"\'input coordinates\' are ",0x18);
              pFVar15 = pTVar13->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"and \'output coordinates\' are ",0x1d);
              pFVar15 = local_258->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,&local_2c8);
LAB_004f6d5a:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_220);
              std::ios_base::~ios_base(local_1a0);
              __return_storage_ptr__ = local_2a8;
              goto LAB_004f647e;
            }
            if (local_78->specificationversion_ < 5) {
              if (iVar8 != 0x10040) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_220);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,
                           "The element data type of \'confidence\' and \'coordinates\' must be MultiArray<DOUBLE> for model specification version earlier than "
                           ,0x80);
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_210,5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", but ",6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,"\'input confidence\' is ",0x16);
                pFVar15 = pTVar12->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
                FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                     local_2c8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                paVar1 = &local_2c8.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,"\'output confidence\' is ",0x17);
                pFVar15 = pTVar14->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
                FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                     local_2c8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,"\'input coordinates\' are ",0x18);
                pFVar15 = pTVar13->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
                FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                     local_2c8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,"and \'output coordinates\' are ",0x1d);
                pFVar15 = local_258->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
                FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                     local_2c8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,". ",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,
                           "To enable MultiArray<FLOAT32>, use the model specification version ",
                           0x43);
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_210,5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," or later.",10);
                std::__cxx11::stringbuf::str();
                Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,&local_2c8);
                goto LAB_004f6d5a;
              }
            }
            else if ((iVar8 != 0x10020) && (iVar8 != 0x10040)) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_220);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,
                         "The element data type of \'confidence\' and \'coordinates\' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but "
                         ,0x76);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"\'input confidence\' is ",0x16);
              pFVar15 = pTVar12->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              paVar1 = &local_2c8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"\'output confidence\' is ",0x17);
              pFVar15 = pTVar14->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"\'input coordinates\' are ",0x18);
              pFVar15 = pTVar13->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,"and \'output coordinates\' are ",0x1d);
              pFVar15 = local_258->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              FeatureType::FeatureType((FeatureType *)local_2a0,pFVar15);
              FeatureType::toString_abi_cxx11_(&local_2c8,(FeatureType *)local_2a0);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_210,local_2c8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,&local_2c8);
              goto LAB_004f6d5a;
            }
            pFVar15 = pTVar14->type_;
            pFVar17 = pFVar15;
            if (pFVar15 == (FeatureType *)0x0) {
              pFVar17 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar17->_oneof_case_[0] == 5) {
              pAVar24 = (ArrayFeatureType *)(pFVar17->Type_).int64type_;
            }
            else {
              pAVar24 = Specification::ArrayFeatureType::default_instance();
              pFVar15 = pTVar14->type_;
            }
            if (pFVar15 == (FeatureType *)0x0) {
              pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            iVar8 = (pAVar24->shape_).current_size_;
            if (pFVar15->_oneof_case_[0] == 5) {
              pAVar24 = (pFVar15->Type_).multiarraytype_;
            }
            else {
              pAVar24 = Specification::ArrayFeatureType::default_instance();
            }
            sVar18 = validate<(MLModelType)610>::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)
                                (pAVar24->ShapeFlexibility_).enumeratedshapes_,
                                (ArrayFeatureType *)(ulong)pAVar24->_oneof_case_[0]);
            bVar6 = iVar8 == 0;
            bVar30 = sVar18 != 0;
            bVar31 = iVar8 == 2;
            bVar32 = sVar18 != 2;
            if ((!bVar6 && !bVar31 || bVar30) && (bVar32 || !bVar6)) {
              local_220 = (undefined1  [8])local_210;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_220,
                         "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes."
                         ,"");
              Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
              goto LAB_004f6729;
            }
            if (bVar31 && !bVar30) {
              pFVar15 = pTVar14->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              if (pFVar15->_oneof_case_[0] == 5) {
                pAVar24 = (pFVar15->Type_).multiarraytype_;
              }
              else {
                pAVar24 = Specification::ArrayFeatureType::default_instance();
              }
              plVar19 = google::protobuf::RepeatedField<long>::Get(&pAVar24->shape_,0);
              pFVar15 = local_258->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              lVar22 = *plVar19;
              if (pFVar15->_oneof_case_[0] == 5) {
                pAVar24 = (pFVar15->Type_).multiarraytype_;
              }
              else {
                pAVar24 = Specification::ArrayFeatureType::default_instance();
              }
              plVar19 = google::protobuf::RepeatedField<long>::Get(&pAVar24->shape_,0);
              if (lVar22 != *plVar19) {
                local_220 = (undefined1  [8])local_210;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_220,
                           "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0)."
                           ,"");
                Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
                goto LAB_004f6729;
              }
            }
            if (!bVar32 && bVar6) {
              pFVar15 = pTVar14->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              if (pFVar15->_oneof_case_[0] == 5) {
                pAVar24 = (pFVar15->Type_).multiarraytype_;
              }
              else {
                pAVar24 = Specification::ArrayFeatureType::default_instance();
              }
              pFVar15 = local_258->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              uVar2 = pAVar24->_oneof_case_[0];
              if (pFVar15->_oneof_case_[0] == 5) {
                pAVar24 = (pFVar15->Type_).multiarraytype_;
              }
              else {
                pAVar24 = Specification::ArrayFeatureType::default_instance();
              }
              if ((uVar2 == 0x1f) && (pAVar24->_oneof_case_[0] == 0x1f)) {
                pFVar15 = pTVar14->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                if (pFVar15->_oneof_case_[0] == 5) {
                  pAVar24 = (pFVar15->Type_).multiarraytype_;
                }
                else {
                  pAVar24 = Specification::ArrayFeatureType::default_instance();
                }
                if (pAVar24->_oneof_case_[0] == 0x1f) {
                  pAVar25 = (pAVar24->ShapeFlexibility_).enumeratedshapes_;
                }
                else {
                  pAVar25 = (ArrayFeatureType_EnumeratedShapes *)
                            Specification::ArrayFeatureType_ShapeRange::default_instance();
                }
                pFVar15 = pTVar14->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                if (pFVar15->_oneof_case_[0] == 5) {
                  pAVar24 = (pFVar15->Type_).multiarraytype_;
                }
                else {
                  pAVar24 = Specification::ArrayFeatureType::default_instance();
                }
                if (pAVar24->_oneof_case_[0] == 0x1f) {
                  pAVar20 = (pAVar24->ShapeFlexibility_).enumeratedshapes_;
                }
                else {
                  pAVar20 = (ArrayFeatureType_EnumeratedShapes *)
                            Specification::ArrayFeatureType_ShapeRange::default_instance();
                }
                pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    (&(pAVar25->shapes_).super_RepeatedPtrFieldBase,0);
                uVar5 = pTVar21->lowerbound_;
                pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    (&(pAVar20->shapes_).super_RepeatedPtrFieldBase,0);
                if (uVar5 == pTVar21->lowerbound_) {
                  pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                      (&(pAVar25->shapes_).super_RepeatedPtrFieldBase,0);
                  lVar22 = pTVar21->upperbound_;
                  pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                      (&(pAVar20->shapes_).super_RepeatedPtrFieldBase,0);
                  if (lVar22 == pTVar21->upperbound_) goto LAB_004f7340;
                }
                local_220 = (undefined1  [8])local_210;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_220,
                           "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0)."
                           ,"");
                Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
              }
              else {
                local_220 = (undefined1  [8])local_210;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_220,
                           "Confidence and coordinates output shapes fexibility must both be ranges"
                           ,"");
                Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
              }
              goto LAB_004f6729;
            }
LAB_004f7340:
            if (local_228->_oneof_case_[1] == 100) {
              lVar22 = 0x18;
LAB_004f7364:
              iVar8 = *(int *)((long)&(((local_228->ClassLabels_).stringclasslabels_)->
                                      super_MessageLite)._vptr_MessageLite + lVar22);
              uVar28 = (ulong)iVar8;
              if ((!bVar31 || bVar30) || (long)uVar28 < 1) {
LAB_004f73fe:
                if ((!bVar32 && bVar6) && 0 < iVar8) {
                  pFVar15 = pTVar14->type_;
                  if (pFVar15 == (FeatureType *)0x0) {
                    pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                  }
                  if (pFVar15->_oneof_case_[0] == 5) {
                    pAVar24 = (pFVar15->Type_).multiarraytype_;
                  }
                  else {
                    pAVar24 = Specification::ArrayFeatureType::default_instance();
                  }
                  if (pAVar24->_oneof_case_[0] == 0x1f) {
                    pAVar25 = (pAVar24->ShapeFlexibility_).enumeratedshapes_;
                  }
                  else {
                    pAVar25 = (ArrayFeatureType_EnumeratedShapes *)
                              Specification::ArrayFeatureType_ShapeRange::default_instance();
                  }
                  this = &pAVar25->shapes_;
                  pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                      (&this->super_RepeatedPtrFieldBase,1);
                  if ((uVar28 < pTVar21->lowerbound_) ||
                     ((pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                           (&this->super_RepeatedPtrFieldBase,1),
                      -1 < pTVar21->upperbound_ &&
                      (pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                           (&this->super_RepeatedPtrFieldBase,1),
                      pTVar21->upperbound_ < (long)uVar28)))) {
                    std::__cxx11::to_string((string *)local_2a0,iVar8);
                    std::operator+(&local_2c8,
                                   "Number of classes is not consistent for class labels (",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2a0);
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
                    psVar26 = (size_type *)(plVar19 + 2);
                    if ((size_type *)*plVar19 == psVar26) {
                      local_210._0_8_ = *psVar26;
                      local_210._8_8_ = plVar19[3];
                      local_220 = (undefined1  [8])local_210;
                    }
                    else {
                      local_210._0_8_ = *psVar26;
                      local_220 = (undefined1  [8])*plVar19;
                    }
                    local_218._M_p = (pointer)plVar19[1];
                    *plVar19 = (long)psVar26;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
                    if (local_220 != (undefined1  [8])local_210) {
                      operator_delete((void *)local_220,local_210._0_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                    local_50.field_2._M_allocated_capacity = local_2a0._16_8_;
                    local_50._M_dataplus._M_p = (pointer)local_2a0._0_8_;
                    __return_storage_ptr__ = local_2a8;
                    if ((element_type *)local_2a0._0_8_ == (element_type *)(local_2a0 + 0x10))
                    goto LAB_004f647e;
                    goto LAB_004f6742;
                  }
                }
                goto LAB_004f7557;
              }
              pFVar15 = pTVar14->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              if (pFVar15->_oneof_case_[0] == 5) {
                pAVar24 = (pFVar15->Type_).multiarraytype_;
              }
              else {
                pAVar24 = Specification::ArrayFeatureType::default_instance();
              }
              puVar23 = (ulong *)google::protobuf::RepeatedField<long>::Get(&pAVar24->shape_,1);
              if (*puVar23 == uVar28) goto LAB_004f73fe;
              std::__cxx11::to_string(&local_50,iVar8);
              std::operator+(&local_98,"Number of classes is not consistent for class labels (",
                             &local_50);
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_98);
              peVar27 = (element_type *)(plVar19 + 2);
              if ((element_type *)*plVar19 == peVar27) {
                local_2a0._16_8_ = (peVar27->super_MessageLite)._vptr_MessageLite;
                local_2a0._24_8_ = plVar19[3];
                local_2a0._0_8_ = (element_type *)(local_2a0 + 0x10);
              }
              else {
                local_2a0._16_8_ = (peVar27->super_MessageLite)._vptr_MessageLite;
                local_2a0._0_8_ = (element_type *)*plVar19;
              }
              local_2a0._8_8_ = plVar19[1];
              *plVar19 = (long)peVar27;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              pFVar15 = pTVar14->type_;
              if (pFVar15 == (FeatureType *)0x0) {
                pFVar15 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              if (pFVar15->_oneof_case_[0] == 5) {
                pAVar24 = (pFVar15->Type_).multiarraytype_;
              }
              else {
                pAVar24 = Specification::ArrayFeatureType::default_instance();
              }
              plVar19 = google::protobuf::RepeatedField<long>::Get(&pAVar24->shape_,1);
              std::__cxx11::to_string(&local_70,*plVar19);
              std::operator+(&local_2c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2a0,&local_70);
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
              psVar26 = (size_type *)(plVar19 + 2);
              if ((size_type *)*plVar19 == psVar26) {
                local_210._0_8_ = *psVar26;
                local_210._8_8_ = plVar19[3];
                local_220 = (undefined1  [8])local_210;
              }
              else {
                local_210._0_8_ = *psVar26;
                local_220 = (undefined1  [8])*plVar19;
              }
              local_218._M_p = (pointer)plVar19[1];
              *plVar19 = (long)psVar26;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              Result::Result(local_2a8,INVALID_MODEL_PARAMETERS,(string *)local_220);
              if (local_220 != (undefined1  [8])local_210) {
                operator_delete((void *)local_220,local_210._0_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((element_type *)local_2a0._0_8_ != (element_type *)(local_2a0 + 0x10)) {
                operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              __return_storage_ptr__ = local_2a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_004f647e;
              goto LAB_004f6742;
            }
            lVar22 = 0x10;
            if (local_228->_oneof_case_[1] == 0x65) goto LAB_004f7364;
LAB_004f7557:
            *(size_type **)local_2a8 = local_280;
            paVar1 = &(local_2a8->m_message).field_2;
            (local_2a8->m_message)._M_dataplus._M_p = (pointer)paVar1;
            __return_storage_ptr__ = local_2a8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278.int64type_ == &local_268) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]);
              *(undefined8 *)((long)&(local_2a8->m_message).field_2 + 8) = local_268._8_8_;
            }
            else {
              (local_2a8->m_message)._M_dataplus._M_p = (pointer)local_278;
              (local_2a8->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]);
            }
          }
          else {
LAB_004f62d8:
            *(size_type **)__return_storage_ptr__ = local_280;
            paVar1 = &(__return_storage_ptr__->m_message).field_2;
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278.int64type_ == &local_268) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                   local_268._8_8_;
            }
            else {
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_278;
              (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]);
            }
          }
          local_278.int64type_ = (Int64FeatureType *)&local_268;
          (__return_storage_ptr__->m_message)._M_string_length = local_270;
          local_270 = 0;
          local_268._M_local_buf[0] = '\0';
          goto LAB_004f647e;
        }
      }
      std::operator+(&local_2c8,"Expected feature \'",(local_228->confidenceoutputfeaturename_).ptr_
                    );
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_220 = (undefined1  [8])local_210;
      psVar26 = (size_type *)(plVar19 + 2);
      if ((size_type *)*plVar19 == psVar26) {
        local_210._0_8_ = *psVar26;
        local_210._8_8_ = plVar19[3];
      }
      else {
        local_210._0_8_ = *psVar26;
        local_220 = (undefined1  [8])*plVar19;
      }
      local_218._M_p = (pointer)plVar19[1];
      *plVar19 = (long)psVar26;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)local_220);
    }
  }
LAB_004f6446:
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220,local_210._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
LAB_004f647e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.int64type_ != &local_268) {
    operator_delete(local_278.int64type_,
                    CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_nonMaximumSuppression>(const Specification::Model& format) {
        const auto& description = format.description();
        const auto& nms = format.nonmaximumsuppression();
        
        //const auto& _confidenceInputFeatureName = nms.confidenceinputfeaturename();
        const auto& inputs = description.input();
        const auto& outputs = description.output();
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        Result result;
        
        // Validate it's an MLModel type
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        int confidenceInputIndex = -1;
        int coordinatesInputIndex = -1;
        int iouThresholdInputIndex = -1;
        int confidenceThresholdInputIndex = -1;
        
        // Make sure each input corresponds a feature name
        for (int i = 0; i < inputs.size(); ++i) {
            const std::string& name = inputs[i].name();
            bool used = false;
            
            if (nms.confidenceinputfeaturename().compare(name) == 0) {
                confidenceInputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesinputfeaturename().compare(name) == 0) {
                coordinatesInputIndex = i;
                used = true;
            }
            
            if (nms.iouthresholdinputfeaturename().compare(name) == 0) {
                iouThresholdInputIndex = i;
                used = true;
            }
            
            if (nms.confidencethresholdinputfeaturename().compare(name) == 0) {
                confidenceThresholdInputIndex = i;
                used = true;
            }
            
            // The input was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Input feature '" + name + "' was not requested by any of the input feature names (e.g. confidenceInputFeatureName).");
            }
        }
        
        if (confidenceInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceinputfeaturename() + "' (as defined by confidenceInputFeatureName) to the model is not present in the model description.");
        }
        
        if (coordinatesInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesinputfeaturename() + "' (as defined by coordinatesInputFeatureName) to the model is not present in the model description.");
        }
        
        int confidenceOutputIndex = -1;
        int coordinatesOutputIndex = -1;
        
        for (int i = 0; i < outputs.size(); ++i) {
            const std::string& name = outputs[i].name();
            bool used = false;
            
            if (nms.confidenceoutputfeaturename().compare(name) == 0) {
                confidenceOutputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesoutputfeaturename().compare(name) == 0) {
                coordinatesOutputIndex = i;
                used = true;
            }
            
            // The output was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not requested by any of the output feature names (e.g. confidenceOutputFeatureName).");
            }
        }
        
        if (confidenceOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceoutputfeaturename() + "' (as defined by confidenceOutputFeatureName) from the model is not present in the model description.");
        }
        
        if (coordinatesOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesoutputfeaturename() + "' (as defined by coordinatesOutputFeatureName) from the model is not present in the model description.");
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.confidenceinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.coordinatesinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the optional inputs
        if (iouThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.iouthresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        
        if (confidenceThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.confidencethresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.confidenceoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.coordinatesoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        if (!(nms.iouthreshold() >= 0.0 && nms.iouthreshold() <= 1.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "iouThreshold must be a value between 0.0 and 1.0.");
            
        }
        
        // Confidence can be greater than 1.0 if the user chooses to have non-probabilistic confidences.
        // However, since 0.0 is considered no confidence and used as a filler value when output shape
        // is larger than number of suppressed predictions, non-negative values are not allowed.
        if (!(nms.confidencethreshold() >= 0.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0.");
            
        }
        
        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& confidence_in = description.input()[confidenceInputIndex];
        const auto& coordinates_in = description.input()[coordinatesInputIndex];
        const auto& confidence_out = description.output()[confidenceOutputIndex];
        const auto& coordinates_out = description.output()[coordinatesOutputIndex];

        const auto confidence_in_type = confidence_in.type().multiarraytype().datatype();
        const auto confidence_out_type = confidence_out.type().multiarraytype().datatype();
        const auto coordinates_in_type = coordinates_in.type().multiarraytype().datatype();
        const auto coordinates_out_type = coordinates_out.type().multiarraytype().datatype();

        if (confidence_in_type != confidence_out_type ||
            confidence_in_type != coordinates_in_type ||
            confidence_in_type != coordinates_out_type) {
            std::stringstream ss;
            ss << "'confidence' and 'coordinates' must use a same element type, but ";
            ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
            ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
            ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
            ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }

        if (format.specificationversion() >= MLMODEL_SPECIFICATION_VERSION_IOS14) {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE &&
                confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        } else {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be MultiArray<DOUBLE> for model specification version earlier than " << MLMODEL_SPECIFICATION_VERSION_IOS14 << ", but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ". ";
                ss << "To enable MultiArray<FLOAT32>, use the model specification version " << MLMODEL_SPECIFICATION_VERSION_IOS14 << " or later.";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        }

        auto rankOfFlexibleShape = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            switch (marray.ShapeFlexibility_case()) {
                case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case CoreML::Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return 0;
            }
        };

        auto hasFlexibleShape  = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() !=  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET;
        };

        auto hasEnumeratedShapes = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kEnumeratedShapes;
        };

        auto hasShapeRange = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kShapeRange;
        };

        
        size_t confOldShapeDim = confidence_out.type().multiarraytype().shape_size();
        size_t confNewShapeDim = rankOfFlexibleShape(confidence_out.type().multiarraytype());

        // These three options are all allowed, anything else will fail
        bool confUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool confUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool confUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);

        if (!(confUnspecified || confUseOld || confUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }

        bool coordsUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool coordsUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool coordsUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);
        
        if (!(coordsUnspecified || coordsUseOld || coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for coordinates output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }
        
        // For now, require consistent usage of new/old
        if ((confUseOld && !coordsUseOld) || (confUseNew && !coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates cannot use a mix of shape (deprecated) and allowedShapes.");
        }
        
        // If both use old shape, make sure shapes are consistent
        if (confUseOld && coordsUseOld &&
            confidence_out.type().multiarraytype().shape(0) != coordinates_out.type().multiarraytype().shape(0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0).");
        }
        
        // If both use new shape, make sure shapes are consistent
        if (confUseNew && coordsUseNew) {
            bool confIsRange = hasShapeRange(confidence_out.type().multiarraytype());
            bool coordsIsRange = hasShapeRange(coordinates_out.type().multiarraytype());

            // Only allow range flexibility
            if (!confIsRange || !coordsIsRange) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes fexibility must both be ranges");
            }

            // Check they have the same range across dimension 0
            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();
            const auto &coordRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if (confRange[0].lowerbound() != coordRange[0].lowerbound() ||
                confRange[0].upperbound() != coordRange[0].upperbound()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0).");
            }
            
        }
        
        // If shape constraints on number of classes are defined, it must be consistent with
        // the number of labels.
        int numLabelNames;
        switch (nms.ClassLabels_case()) {
            case Specification::NonMaximumSuppression::kInt64ClassLabels:
                numLabelNames = nms.int64classlabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::kStringClassLabels:
                numLabelNames = nms.stringclasslabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::CLASSLABELS_NOT_SET:
                numLabelNames = 0;
                break;
        }
        
        if (confUseOld && numLabelNames > 0 &&
            confidence_out.type().multiarraytype().shape(1) != numLabelNames) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape (" + std::to_string(confidence_out.type().multiarraytype().shape(1)) + ")");
        }
        
        if (confUseNew && numLabelNames > 0) {
            // Already checked confUseNew is a range above
            // Just check the range is correct

            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if ((numLabelNames < confRange[1].lowerbound() ||
                  (confRange[1].upperbound() >= 0  && numLabelNames > confRange[1].upperbound()))) {
                      return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape range");
            }
        }

        return result;
    }